

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate.c
# Opt level: O2

errr finish_parse_profile(parser *p)

{
  ulong uVar1;
  undefined8 *puVar2;
  room_profile *prVar3;
  char *pcVar4;
  room_builder_conflict p_Var5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  cave_profile *pcVar9;
  angband_constants *paVar10;
  undefined8 *puVar11;
  wchar_t *pwVar12;
  room_profile *prVar13;
  long lVar14;
  cave_profile *pcVar15;
  undefined8 *puVar16;
  ushort uVar17;
  wchar_t wVar18;
  undefined8 *puVar19;
  size_t len;
  ulong uVar20;
  byte bVar21;
  
  bVar21 = 0;
  puVar11 = (undefined8 *)parser_priv(p);
  paVar10 = z_info;
  z_info->profile_max = 0;
  uVar17 = 0;
  for (; puVar11 != (undefined8 *)0x0; puVar11 = (undefined8 *)*puVar11) {
    uVar17 = uVar17 + 1;
    paVar10->profile_max = uVar17;
  }
  cave_profiles = (cave_profile *)mem_zalloc((ulong)uVar17 << 7);
  uVar17 = z_info->profile_max;
  puVar11 = (undefined8 *)parser_priv(p);
  uVar20 = (ulong)uVar17;
  while (pcVar9 = cave_profiles, puVar11 != (undefined8 *)0x0) {
    uVar1 = uVar20 - 1;
    puVar19 = puVar11;
    pcVar15 = cave_profiles + uVar1;
    for (lVar14 = 0x10; lVar14 != 0; lVar14 = lVar14 + -1) {
      pcVar15->next = (cave_profile *)*puVar19;
      puVar19 = puVar19 + (ulong)bVar21 * -2 + 1;
      pcVar15 = (cave_profile *)((long)pcVar15 + (ulong)bVar21 * -0x10 + 8);
    }
    puVar19 = (undefined8 *)*puVar11;
    pcVar15 = pcVar9 + uVar20;
    if ((long)(ulong)z_info->profile_max <= (long)uVar20) {
      pcVar15 = (cave_profile *)0x0;
    }
    pwVar12 = &pcVar9[uVar1].n_room_profiles;
    pcVar9[uVar1].next = pcVar15;
    puVar16 = (undefined8 *)puVar11[0xe];
    if (puVar16 == (undefined8 *)0x0) {
      *pwVar12 = L'\0';
      pcVar9[uVar1].room_profiles = (room_profile *)0x0;
    }
    else {
      len = 0;
      wVar18 = L'\0';
      for (; puVar16 != (undefined8 *)0x0; puVar16 = (undefined8 *)*puVar16) {
        wVar18 = wVar18 + L'\x01';
        len = len + 0x38;
      }
      *pwVar12 = wVar18;
      prVar13 = (room_profile *)mem_zalloc(len);
      lVar14 = 0;
      puVar16 = (undefined8 *)puVar11[0xe];
      prVar3 = prVar13;
      while( true ) {
        if (cave_profiles[uVar1].n_room_profiles <= lVar14) break;
        pcVar4 = (char *)puVar16[1];
        p_Var5 = (room_builder_conflict)puVar16[2];
        uVar6 = puVar16[3];
        uVar7 = puVar16[4];
        uVar8 = puVar16[5];
        prVar3->next = (room_profile *)*puVar16;
        prVar3->name = pcVar4;
        *(undefined8 *)&prVar3->cutoff = puVar16[6];
        prVar3->width = (int)uVar7;
        prVar3->level = (int)((ulong)uVar7 >> 0x20);
        prVar3->pit = (_Bool)(char)uVar8;
        *(int3 *)&prVar3->field_0x29 = (int3)((ulong)uVar8 >> 8);
        prVar3->rarity = (int)((ulong)uVar8 >> 0x20);
        prVar3->builder = p_Var5;
        prVar3->rating = (int)uVar6;
        prVar3->height = (int)((ulong)uVar6 >> 0x20);
        if (prVar3->next != (room_profile *)0x0) {
          prVar3->next = prVar3 + 1;
        }
        puVar2 = (undefined8 *)*puVar16;
        mem_free(puVar16);
        lVar14 = lVar14 + 1;
        puVar16 = puVar2;
        prVar3 = prVar3 + 1;
      }
      cave_profiles[uVar1].room_profiles = prVar13;
    }
    mem_free(puVar11);
    uVar20 = uVar1;
    puVar11 = puVar19;
  }
  parser_destroy(p);
  return 0;
}

Assistant:

static errr finish_parse_profile(struct parser *p) {
	struct cave_profile *n, *c = parser_priv(p);
	int num;

	/* Count the list */
	z_info->profile_max = 0;
	while (c) {
		z_info->profile_max++;
		c = c->next;
	}

	/* Allocate the array and copy the records to it */
	cave_profiles = mem_zalloc(z_info->profile_max * sizeof(*c));
	num = z_info->profile_max - 1;
	for (c = parser_priv(p); c; c = n) {
		/* Main record */
		memcpy(&cave_profiles[num], c, sizeof(*c));
		n = c->next;
		if (num < z_info->profile_max - 1) {
			cave_profiles[num].next = &cave_profiles[num + 1];
		} else {
			cave_profiles[num].next = NULL;
		}

		if (c->room_profiles) {
			struct room_profile *r_old = c->room_profiles;
			struct room_profile *r_new;
			int i;

			/* Count the room profiles */
			cave_profiles[num].n_room_profiles = 0;
			while (r_old) {
				++cave_profiles[num].n_room_profiles;
				r_old = r_old->next;
			}

			/* Now allocate the room profile array */
			r_new = mem_zalloc(cave_profiles[num].n_room_profiles
				* sizeof(*r_new));

			r_old = c->room_profiles;
			for (i = 0; i < cave_profiles[num].n_room_profiles; i++) {
				struct room_profile *r_temp = r_old;

				/* Copy from the linked list to the array */
				memcpy(&r_new[i], r_old, sizeof(*r_old));

				/* Set the next profile pointer correctly. */
				if (r_new[i].next) {
					r_new[i].next = &r_new[i + 1];
				}

				/* Tidy up and advance to the next profile. */
				r_old = r_old->next;
				mem_free(r_temp);
			}

			cave_profiles[num].room_profiles = r_new;
		} else {
			cave_profiles[num].n_room_profiles = 0;
			cave_profiles[num].room_profiles = NULL;
		}

		mem_free(c);
		num--;
	}

	parser_destroy(p);
	return 0;
}